

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_4,_2> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,2,4>
          (Matrix<float,_4,_2> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_4> *a,
          Vector<float,_2> *b)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector<float,_4> *pVVar6;
  bool bVar7;
  Matrix<float,_4,_2> *res;
  bool bVar8;
  float *pfVar9;
  long lVar10;
  int col;
  long lVar11;
  float fVar12;
  Matrix<float,_2,_4> retVal;
  
  res = __return_storage_ptr__;
  pfVar1 = retVal.m_data.m_data[0].m_data + 1;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  retVal.m_data.m_data[3].m_data[0] = 0.0;
  retVal.m_data.m_data[3].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  lVar10 = 0;
  pfVar9 = (float *)&retVal;
  bVar7 = true;
  do {
    bVar8 = bVar7;
    lVar11 = 0;
    do {
      fVar12 = 1.0;
      if (lVar10 != lVar11) {
        fVar12 = 0.0;
      }
      pfVar9[lVar11 * 2] = fVar12;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    lVar10 = 1;
    pfVar9 = pfVar1;
    bVar7 = false;
  } while (bVar8);
  fVar12 = *(float *)this;
  fVar3 = *(float *)(this + 4);
  fVar4 = *(float *)(this + 8);
  fVar5 = *(float *)(this + 0xc);
  lVar10 = 0;
  pfVar9 = (float *)&retVal;
  bVar7 = true;
  do {
    bVar8 = bVar7;
    fVar2 = a->m_data[lVar10];
    *pfVar9 = fVar2 * fVar12;
    pfVar9[2] = fVar2 * fVar3;
    pfVar9[4] = fVar2 * fVar4;
    pfVar9[6] = fVar2 * fVar5;
    lVar10 = 1;
    pfVar9 = pfVar1;
    bVar7 = false;
  } while (bVar8);
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 1.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 1.0;
  pVVar6 = (__return_storage_ptr__->m_data).m_data;
  pVVar6[1].m_data[2] = 0.0;
  pVVar6[1].m_data[3] = 0.0;
  lVar10 = 0;
  pfVar9 = (float *)&retVal;
  bVar7 = true;
  do {
    bVar8 = bVar7;
    fVar12 = pfVar9[2];
    fVar3 = pfVar9[4];
    fVar4 = pfVar9[6];
    pVVar6 = (__return_storage_ptr__->m_data).m_data + lVar10;
    pVVar6->m_data[0] = *pfVar9;
    pVVar6->m_data[1] = fVar12;
    pVVar6->m_data[2] = fVar3;
    pVVar6->m_data[3] = fVar4;
    lVar10 = 1;
    pfVar9 = pfVar1;
    bVar7 = false;
  } while (bVar8);
  return res;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}